

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

int AF_AActor_GiveSecret
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *actor;
  bool bVar1;
  bool local_3d;
  bool playsound;
  bool printmessage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22d,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22d,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  local_3d = true;
  if (actor != (AActor *)0x0) {
    local_3d = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
  }
  if (local_3d == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22d,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22e,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22e,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22f,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22f,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  P_GiveSecret(actor,param[1].field_0.i != 0,param[2].field_0.i != 0,-1);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GiveSecret)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL(printmessage);
	PARAM_BOOL(playsound);
	P_GiveSecret(self, printmessage, playsound, -1);
	return 0;
}